

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_context.hpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::context::context(context *this,not_null<pstore::database_*> db_)

{
  context *this_local;
  not_null<pstore::database_*> db__local;
  
  (this->db).ptr_ = db_.ptr_;
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>>
  ::
  stack<std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>,void>
            ((stack<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>>
              *)&this->stack);
  std::__cxx11::
  list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  ::list(&this->patches);
  return;
}

Assistant:

explicit context (gsl::not_null<database *> const db_) noexcept
                        : db{db_} {}